

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  int iVar2;
  undefined8 it;
  long lVar3;
  basic_appender<char> bVar4;
  int **ppiVar5;
  ulong uVar6;
  ulong uVar7;
  sign *psVar8;
  sign *psVar9;
  buffer<char> *buf;
  size_t sVar10;
  int iVar11;
  byte bVar12;
  undefined1 uVar13;
  undefined8 uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [2];
  bool local_e4 [12];
  int local_d8;
  sign local_d4;
  basic_specs local_d0;
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d0 = (basic_specs)f->significand;
  lVar15 = 0x3f;
  if (((ulong)local_d0 | 1) != 0) {
    for (; ((ulong)local_d0 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
    }
  }
  iVar11 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
           (uint)((ulong)local_d0 <
                 (ulong)*(basic_specs *)
                         (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                         (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] * 8));
  uVar6 = (ulong)((iVar11 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar16 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e4._4_8_ = out.container;
  local_d8 = iVar11;
  local_d4 = s;
  local_c8.super_basic_specs = local_d0;
  if ((uVar16 >> 0xe & 1) != 0) {
    local_c8.width = s;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar16 = (specs->super_basic_specs).data_;
    s = local_c8.width;
  }
  uVar14 = auStack_a4._4_8_;
  it = local_e4._4_8_;
  uVar1 = f->exponent;
  iVar18 = iVar11 + uVar1;
  iVar2 = specs->precision;
  bVar12 = (byte)uVar16 & 7;
  if (bVar12 == 1) goto LAB_00161252;
  if ((uVar16 & 7) != 2) {
    if (iVar18 < -3) {
LAB_00161252:
      iVar19 = iVar11 + -1 + uVar1;
      if ((uVar16 >> 0xd & 1) == 0) {
        uVar7 = 0;
        if (iVar11 == 1) {
          local_e6[0] = '\0';
          uVar7 = 0;
        }
      }
      else {
        uVar7 = 0;
        if (0 < iVar2 - iVar11) {
          uVar7 = (ulong)(uint)(iVar2 - iVar11);
        }
        uVar6 = uVar6 + uVar7;
      }
      iVar2 = 1 - iVar18;
      if (0 < iVar18) {
        iVar2 = iVar19;
      }
      lVar15 = 2;
      if (99 < iVar2) {
        lVar15 = (ulong)(999 < iVar2) + 3;
      }
      sVar10 = (3 - (ulong)(local_e6[0] == '\0')) + uVar6 + lVar15;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = iVar11;
      auStack_a4._4_5_ = CONCAT14('0',(int)uVar7);
      auStack_a4._10_2_ = SUB82(uVar14,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar16 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar19;
      local_b8._8_8_ = local_d0;
      if (specs->width < 1) {
        uVar6 = sVar10 + *(size_t *)(local_e4._4_8_ + 8);
        local_d0 = (basic_specs)f;
        if (*(size_t *)(local_e4._4_8_ + 0x10) < uVar6) {
          local_d0 = (basic_specs)f;
          (**(grow_fun *)(local_e4._4_8_ + 0x18))((buffer<char> *)local_e4._4_8_,uVar6);
        }
        bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                ::anon_class_40_8_fd1bf2f9::operator()
                          ((anon_class_40_8_fd1bf2f9 *)local_b8,(iterator)it);
      }
      else {
        local_d0 = (basic_specs)f;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_e4._4_8_,specs,sVar10,sVar10,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar4.container;
    }
    if (0 < iVar2) {
      exp_upper = iVar2;
    }
    if (exp_upper < iVar18) goto LAB_00161252;
  }
  local_c8.precision = iVar18;
  if (-1 < (int)uVar1) {
    lVar15 = uVar1 + uVar6;
    local_e4._0_4_ = iVar2 - iVar18;
    if ((uVar16 >> 0xd & 1) != 0) {
      lVar15 = lVar15 + 1;
      if (((int)local_e4._0_4_ < 1) && (bVar12 != 2)) {
        local_e4[0] = false;
        local_e4[1] = false;
        local_e4[2] = false;
        local_e4[3] = false;
      }
      else if (0 < (int)local_e4._0_4_) {
        lVar15 = lVar15 + (ulong)(uint)local_e4._0_4_;
      }
    }
    local_d0 = (basic_specs)f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar16 >> 0xe) & 1));
    iVar11 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      psVar9 = (sign *)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar14 = local_70._0_8_;
      do {
        if ((sign *)uVar14 == psVar9) {
          uVar13 = *(byte *)((long)psVar9 + -1);
          uVar14 = psVar9;
        }
        else {
          uVar13 = (undefined1)*(sign *)uVar14;
          if ((byte)(uVar13 + 0x81) < 0x82) goto LAB_00161459;
          uVar14 = (sign *)(uVar14 + 1);
        }
        iVar11 = iVar11 + (char)uVar13;
        if (iVar18 <= iVar11) goto LAB_00161459;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00161459:
    local_b8._0_8_ = &local_d4;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_d8;
    auStack_a4._4_4_ = local_d0.data_;
    auStack_a4[8] = local_d0.fill_data_[0];
    auStack_a4[9] = local_d0.fill_data_[1];
    auStack_a4[10] = local_d0.fill_data_[2];
    auStack_a4[0xb] = local_d0.fill_data_[3];
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e4;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)it,specs,lVar15 + lVar3,lVar15 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    ppiVar5 = &local_60;
LAB_0016156f:
    if ((int **)ppiVar5[-2] == ppiVar5) {
      return (basic_appender<char>)bVar4.container;
    }
    operator_delete(ppiVar5[-2]);
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar18) {
    uVar17 = 0;
    local_e4._0_4_ = iVar2 - iVar11 & (int)(uVar16 << 0x12) >> 0x1f;
    uVar7 = (ulong)(uint)local_e4._0_4_;
    if ((int)local_e4._0_4_ < 1) {
      uVar7 = uVar17;
    }
    local_d0 = (basic_specs)f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar16 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      psVar8 = (sign *)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar15 = 0;
      psVar9 = (sign *)local_b8._0_8_;
      do {
        if (psVar9 == psVar8) {
          uVar13 = *(byte *)((long)psVar8 + -1);
          psVar9 = psVar8;
        }
        else {
          uVar13 = (undefined1)*psVar9;
          if ((byte)(uVar13 + 0x81) < 0x82) goto LAB_001614fa;
          psVar9 = (sign *)((long)psVar9 + 1);
        }
        uVar16 = (int)uVar17 + (int)(char)uVar13;
        uVar17 = (ulong)uVar16;
        if (iVar18 <= (int)uVar16) goto LAB_001614fa;
        lVar15 = lVar15 + 1;
      } while( true );
    }
    lVar15 = 0;
LAB_001614fa:
    sVar10 = uVar7 + uVar6 + 1 + lVar15;
    local_70._M_allocated_capacity = (size_type)&local_d4;
    local_70._8_8_ = &local_c8;
    local_60 = &local_d8;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)local_e4;
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_e4._4_8_,specs,sVar10,sVar10,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_);
    }
    ppiVar5 = (int **)(local_b8 + 0x10);
    goto LAB_0016156f;
  }
  iVar19 = -iVar18;
  local_70._M_allocated_capacity._0_4_ = iVar19;
  if (iVar11 == 0) {
    if ((-1 < iVar2) && (SBORROW4(iVar2,iVar19) != iVar2 + iVar18 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar2;
      iVar19 = iVar2;
    }
    if (iVar19 == 0) {
      local_e4[0] = (bool)(char)((uVar16 & 0x2000) >> 0xd);
      iVar11 = 2 - (uint)((uVar16 & 0x2000) == 0);
      iVar19 = 0;
      goto LAB_001615b1;
    }
  }
  local_e4[0] = true;
  iVar11 = 2;
LAB_001615b1:
  sVar10 = (uint)(iVar19 + iVar11) + uVar6;
  local_b8._0_8_ = &local_d4;
  local_b8._8_8_ = local_e4;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_d8;
  local_d0 = (basic_specs)f;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_e4._4_8_,specs,sVar10,sVar10,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}